

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O3

void __thiscall
BRTS<TTA>::FindRunsMem(BRTS<TTA> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong *puVar10;
  unsigned_short uVar11;
  Run *pRVar12;
  Run *pRVar13;
  Run *pRVar14;
  long lVar15;
  unsigned_short uVar16;
  ulong uVar17;
  ulong *puVar18;
  short sVar19;
  Run *pRVar20;
  ulong uVar21;
  
  lVar9 = (long)data_width;
  uVar17 = *bits_start;
  sVar19 = 0;
  puVar18 = bits_start;
  pRVar20 = runs;
  while( true ) {
    for (; uVar17 != 0; uVar17 = (~uVar17 >> ((byte)lVar4 & 0x3f)) << ((byte)lVar4 & 0x3f)) {
      lVar4 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      pRVar20->start_pos = (short)lVar4 + sVar19;
      uVar17 = (~uVar17 >> ((byte)lVar4 & 0x3f)) << ((byte)lVar4 & 0x3f);
      if (uVar17 == 0) {
        do {
          sVar19 = sVar19 + 0x40;
          puVar10 = puVar18 + 1;
          puVar18 = puVar18 + 1;
        } while (*puVar10 == 0xffffffffffffffff);
        uVar17 = ~*puVar10;
      }
      lVar4 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      pRVar20->end_pos = (short)lVar4 + sVar19;
      uVar7 = TTA::MemNewLabel();
      pRVar20->label = uVar7;
      pRVar20 = pRVar20 + 1;
    }
    puVar18 = puVar18 + 1;
    if (puVar18 == bits_start + lVar9) break;
    sVar19 = sVar19 + 0x40;
    uVar17 = *puVar18;
  }
  pRVar20->start_pos = 0xffff;
  pRVar20->end_pos = 0xffff;
  if (1 < height) {
    uVar17 = 1;
    do {
      pRVar12 = pRVar20 + 1;
      puVar18 = bits_start + uVar17 * lVar9;
      puVar10 = puVar18 + lVar9;
      uVar21 = *puVar18;
      lVar4 = 0;
      pRVar20 = pRVar12;
      while( true ) {
        for (; uVar21 != 0; uVar21 = ~uVar21 & -1L << ((byte)lVar6 & 0x3f)) {
          lVar5 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar21 = (~uVar21 >> ((byte)lVar5 & 0x3f)) << ((byte)lVar5 & 0x3f);
          lVar15 = lVar4;
          if (uVar21 == 0) {
            do {
              lVar15 = lVar15 + 0x40;
              puVar1 = puVar18 + 1;
              puVar18 = puVar18 + 1;
            } while (*puVar1 == 0xffffffffffffffff);
            uVar21 = ~*puVar1;
          }
          lVar6 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar16 = (unsigned_short)(lVar4 + lVar5);
          pRVar14 = runs + -1;
          do {
            pRVar13 = pRVar14;
            runs = runs + 1;
            uVar2 = pRVar13[1].end_pos;
            pRVar14 = pRVar13 + 1;
          } while ((uint)uVar2 < ((uint)(lVar4 + lVar5) & 0xffff));
          uVar11 = (unsigned_short)(lVar6 + lVar15);
          uVar7 = (uint)(lVar6 + lVar15) & 0xffff;
          if (uVar7 < pRVar14->start_pos) {
            pRVar20->start_pos = uVar16;
            pRVar20->end_pos = uVar11;
            uVar8 = TTA::MemNewLabel();
          }
          else {
            uVar8 = pRVar13[1].label;
            TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar8] =
                 TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar8] + 1;
            uVar8 = TTA::mem_rtable_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar8];
            for (; (uVar2 < uVar7 && (pRVar14 = runs, runs->start_pos <= uVar7)); runs = runs + 1) {
              uVar3 = runs->label;
              TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar3] =
                   TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar3] + 1;
              if (uVar8 != TTA::mem_rtable_.vec_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar3]) {
                uVar8 = TTA::MemMerge(uVar8,TTA::mem_rtable_.vec_.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[(int)uVar3]);
              }
              uVar2 = runs->end_pos;
            }
            pRVar20->start_pos = uVar16;
            pRVar20->end_pos = uVar11;
          }
          pRVar20->label = uVar8;
          pRVar20 = pRVar20 + 1;
          lVar4 = lVar15;
          runs = pRVar14;
        }
        puVar18 = puVar18 + 1;
        if (puVar18 == puVar10) break;
        uVar21 = *puVar18;
        lVar4 = lVar4 + 0x40;
      }
      pRVar20->start_pos = 0xffff;
      pRVar20->end_pos = 0xffff;
      uVar17 = uVar17 + 1;
      runs = pRVar12;
    } while (uVar17 != (uint)height);
  }
  uVar7 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
  return;
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::MemGetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::MemMerge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }